

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O3

void __thiscall
RecordType::DoGenParseCode(RecordType *this,Output *out_cc,Env *env,DataPtr *data,int flags)

{
  RecordFieldList *pRVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ID *pIVar6;
  DataPtr *pDVar7;
  char *pcVar8;
  pointer ppRVar9;
  undefined4 in_register_00000084;
  
  if (((this->super_Type).incremental_input_ == false) &&
     (iVar4 = (*(this->super_Type).super_DataDepElement._vptr_DataDepElement[0x13])
                        (this,env,env,data,CONCAT44(in_register_00000084,flags)), -1 < iVar4)) {
    Type::GenBoundaryCheck(&this->super_Type,out_cc,env,data);
  }
  if ((this->super_Type).incremental_parsing_ == true) {
    pcVar5 = Env::LValue(env,parsing_state_id);
    Output::println(out_cc,"switch ( %s ) {",pcVar5);
    Output::println(out_cc,"case 0:");
    out_cc->indent_ = out_cc->indent_ + 1;
    pRVar1 = this->record_fields_;
    if ((pRVar1 != (RecordFieldList *)0x0) &&
       (ppRVar9 = (pRVar1->super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,
       ppRVar9 !=
       (pRVar1->super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>)._M_impl.
       super__Vector_impl_data._M_finish)) {
      do {
        (*((*ppRVar9)->super_Field).super_DataDepElement._vptr_DataDepElement[0xb])
                  (*ppRVar9,out_cc,env);
        Output::println(out_cc,"");
        ppRVar9 = ppRVar9 + 1;
      } while (ppRVar9 !=
               (this->record_fields_->
               super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    Output::println(out_cc,"");
    pIVar6 = Type::parsing_complete_var(&this->super_Type);
    pcVar5 = Env::LValue(env,pIVar6);
    Output::println(out_cc,"%s = true;",pcVar5);
    out_cc->indent_ = out_cc->indent_ + -1;
    Output::println(out_cc,"}");
  }
  else {
    pRVar1 = this->record_fields_;
    if ((pRVar1 != (RecordFieldList *)0x0) &&
       (ppRVar9 = (pRVar1->super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,
       ppRVar9 !=
       (pRVar1->super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>)._M_impl.
       super__Vector_impl_data._M_finish)) {
      do {
        (*((*ppRVar9)->super_Field).super_DataDepElement._vptr_DataDepElement[0xb])
                  (*ppRVar9,out_cc,env);
        Output::println(out_cc,"");
        ppRVar9 = ppRVar9 + 1;
      } while (ppRVar9 !=
               (this->record_fields_->
               super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if ((this->super_Type).incremental_input_ == true) {
      pIVar6 = Type::parsing_complete_var(&this->super_Type);
      pcVar5 = Env::LValue(env,pIVar6);
      Output::println(out_cc,"%s = true;",pcVar5);
    }
  }
  if (((this->super_Type).incremental_input_ == false) &&
     (bVar3 = Type::AddSizeVar(&this->super_Type,out_cc,env), bVar3)) {
    pDVar7 = RecordField::getFieldEnd
                       ((this->record_fields_->
                        super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish[-1],out_cc,env);
    pIVar6 = Type::size_var(&this->super_Type);
    pcVar5 = Env::LValue(env,pIVar6);
    pcVar2 = (pDVar7->ptr_expr_)._M_dataplus._M_p;
    pcVar8 = Env::RValue(env,begin_of_data);
    Output::println(out_cc,"%s = %s - %s;",pcVar5,pcVar2,pcVar8);
    pIVar6 = Type::size_var(&this->super_Type);
    Env::SetEvaluated(env,pIVar6,true);
  }
  if (((this->super_Type).boundary_checked_ == false) &&
     (iVar4 = (*((this->record_fields_->
                 super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1]->super_Field).super_DataDepElement.
                _vptr_DataDepElement[0xd])(), (char)iVar4 == '\0')) {
    Type::GenBoundaryCheck(&this->super_Type,out_cc,env,data);
    return;
  }
  return;
}

Assistant:

void RecordType::DoGenParseCode(Output* out_cc, Env* env, const DataPtr& data, int flags)
	{
	if ( ! incremental_input() && StaticSize(env) >= 0 )
		GenBoundaryCheck(out_cc, env, data);

	if ( incremental_parsing() )
		{
		out_cc->println("switch ( %s ) {", env->LValue(parsing_state_id));

		out_cc->println("case 0:");
		out_cc->inc_indent();
		foreach (i, RecordFieldList, record_fields_)
			{
			RecordField* f = *i;
			f->GenParseCode(out_cc, env);
			out_cc->println("");
			}
		out_cc->println("");
		out_cc->println("%s = true;", env->LValue(parsing_complete_var()));
		out_cc->dec_indent();
		out_cc->println("}");
		}
	else
		{
		ASSERT(data.id() == begin_of_data && data.offset() == 0);
		foreach (i, RecordFieldList, record_fields_)
			{
			RecordField* f = *i;
			f->GenParseCode(out_cc, env);
			out_cc->println("");
			}
		if ( incremental_input() )
			{
			ASSERT(parsing_complete_var());
			out_cc->println("%s = true;", env->LValue(parsing_complete_var()));
			}
		}

	if ( ! incremental_input() && AddSizeVar(out_cc, env) )
		{
		const DataPtr& end_of_record_dataptr = record_fields_->back()->getFieldEnd(out_cc, env);

		out_cc->println("%s = %s - %s;", env->LValue(size_var()), end_of_record_dataptr.ptr_expr(),
		                env->RValue(begin_of_data));
		env->SetEvaluated(size_var());
		}

	if ( ! boundary_checked() )
		{
		RecordField* last_field = record_fields_->back();
		if ( ! last_field->BoundaryChecked() )
			GenBoundaryCheck(out_cc, env, data);
		}
	}